

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result * __thiscall
testing::internal::
ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>_>
::
Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>,_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Perform(Result *__return_storage_ptr__,
         Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>,_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *this,ArgumentTuple *param_1)

{
  bool bVar1;
  ostream *poVar2;
  unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_> *puVar3;
  GTestLog local_24;
  ArgumentTuple *local_20;
  ArgumentTuple *param_1_local;
  Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>,_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  local_20 = param_1;
  param_1_local = (ArgumentTuple *)this;
  this_local = (Impl<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>,_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)__return_storage_ptr__;
  bVar1 = IsTrue((bool)((this->performed_ ^ 0xffU) & 1));
  if (!bVar1) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
                       ,0x2c5);
    poVar2 = GTestLog::GetStream(&local_24);
    poVar2 = std::operator<<(poVar2,"Condition !performed_ failed. ");
    std::operator<<(poVar2,"A ByMove() action should only be performed once.");
    GTestLog::~GTestLog(&local_24);
  }
  this->performed_ = true;
  puVar3 = &std::
            __shared_ptr_access<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->wrapper_)->payload;
  std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>::unique_ptr
            (__return_storage_ptr__,puVar3);
  return __return_storage_ptr__;
}

Assistant:

Result Perform(const ArgumentTuple&) override {
      GTEST_CHECK_(!performed_)
          << "A ByMove() action should only be performed once.";
      performed_ = true;
      return std::move(wrapper_->payload);
    }